

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

bool wasm::anon_unknown_0::shapeEq(Type a,Type b)

{
  pointer pTVar1;
  bool bVar2;
  Nullability NVar3;
  Nullability NVar4;
  Tuple *pTVar5;
  Tuple *pTVar6;
  pointer pTVar7;
  HeapType HVar8;
  ulong uVar9;
  Type local_38;
  Type a_local;
  Type b_local;
  
  bVar2 = true;
  if (a.id != b.id) {
    local_38.id = a.id;
    a_local = b;
    bVar2 = wasm::Type::isTuple(&local_38);
    if ((bVar2) && (bVar2 = wasm::Type::isTuple(&a_local), bVar2)) {
      pTVar5 = wasm::Type::getTuple(&local_38);
      pTVar6 = wasm::Type::getTuple(&a_local);
      pTVar7 = (pTVar5->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar1 = (pTVar5->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)pTVar1 - (long)pTVar7 ==
          (long)(pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pTVar6->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start) {
        if (pTVar1 == pTVar7) {
          return true;
        }
        uVar9 = 0;
        do {
          bVar2 = shapeEq((Type)pTVar7[uVar9].id,
                          (Type)(pTVar6->types).
                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar9].id);
          if (!bVar2) {
            return bVar2;
          }
          uVar9 = uVar9 + 1;
          pTVar7 = (pTVar5->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(pTVar5->types).
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3
                                ));
        return bVar2;
      }
    }
    else {
      bVar2 = wasm::Type::isRef(&local_38);
      if ((bVar2) &&
         (((bVar2 = wasm::Type::isRef(&a_local), bVar2 &&
           (HVar8 = wasm::Type::getHeapType(&local_38), 0xd < HVar8.id)) &&
          (HVar8 = wasm::Type::getHeapType(&a_local), 0xd < HVar8.id)))) {
        NVar3 = wasm::Type::getNullability(&local_38);
        NVar4 = wasm::Type::getNullability(&a_local);
        return NVar3 == NVar4;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool shapeEq(Type a, Type b) {
  if (a == b) {
    return true;
  }
  if (a.isTuple() && b.isTuple()) {
    return shapeEq(a.getTuple(), b.getTuple());
  }
  // The only thing allowed to differ is the non-basic heap type child, since we
  // don't know before running the DFA partition refinement whether different
  // heap type children will end up being merged. Children that won't be merged
  // will end up being differentiated by the partition refinement.
  if (!a.isRef() || !b.isRef()) {
    return false;
  }
  if (a.getHeapType().isBasic() || b.getHeapType().isBasic()) {
    return false;
  }
  if (a.getNullability() != b.getNullability()) {
    return false;
  }
  return true;
}